

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  size_t sVar11;
  Allocator *pAVar12;
  unsigned_long uVar13;
  Mat *this_00;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  pointer pfVar18;
  ulong uVar19;
  int *piVar20;
  pointer pfVar21;
  pointer pBVar22;
  float *pfVar23;
  pointer pBVar24;
  int iVar25;
  ulong uVar26;
  float *pfVar27;
  ulong uVar28;
  pointer pMVar29;
  float *pfVar30;
  int j;
  ulong uVar31;
  int i;
  long lVar32;
  float *pfVar33;
  long lVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 in_XMM1 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> bbox_scores;
  int local_1b8;
  uint local_1a8;
  uint uStack_1a4;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  float *local_d8;
  float *local_d0;
  float local_c8;
  float fStack_c4;
  value_type local_70;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b8 = -1;
  uVar28 = 0;
  while( true ) {
    pMVar29 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(((long)(bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar29) / 0x48) <= uVar28
       ) break;
    iVar25 = pMVar29[uVar28].c / this->num_box;
    if (iVar25 != this->num_class + 5) goto LAB_003e0e0a;
    uVar2 = pMVar29[uVar28].w;
    uVar5 = pMVar29[uVar28].h;
    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)&picked,(long)this->num_box);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&bbox_scores,(long)this->num_box);
    pMVar29 = pMVar29 + uVar28;
    fVar35 = (float)(int)uVar2;
    fVar38 = (float)(int)uVar5;
    auVar42._4_4_ = fVar38;
    auVar42._0_4_ = fVar35;
    auVar42._8_8_ = 0;
    auVar42 = rcpps(in_XMM1,auVar42);
    local_58 = auVar42._0_4_;
    fStack_54 = auVar42._4_4_;
    fStack_50 = auVar42._8_4_;
    fStack_4c = auVar42._12_4_;
    uVar14 = uVar2;
    if ((int)uVar2 < 1) {
      uVar14 = 0;
    }
    uVar15 = uVar5;
    if ((int)uVar5 < 1) {
      uVar15 = 0;
    }
    local_58 = (1.0 - fVar35 * local_58) * local_58 + local_58;
    fStack_54 = (1.0 - fVar38 * fStack_54) * fStack_54 + fStack_54;
    fStack_50 = (0.0 - fStack_50 * 0.0) * fStack_50 + fStack_50;
    fStack_4c = (0.0 - fStack_4c * 0.0) * fStack_4c + fStack_4c;
    in_XMM1 = ZEXT416((uint)(1.0 / fVar38));
    for (lVar34 = 0; uVar16 = (ulong)this->num_box, lVar34 < (long)uVar16; lVar34 = lVar34 + 1) {
      lVar32 = lVar34 * iVar25;
      uVar4 = *(undefined8 *)((long)(this->biases).data + lVar34 * 8);
      pvVar10 = pMVar29->data;
      pBVar22 = (pointer)pMVar29->elemsize;
      sVar11 = pMVar29->cstep;
      iVar7 = pMVar29->w;
      iVar8 = pMVar29->h;
      iVar9 = pMVar29->d;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((lVar32 + 5) * sVar11 * (long)pBVar22 + (long)pvVar10);
      pAVar12 = pMVar29->allocator;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pBVar22;
      (*this->softmax->_vptr_Layer[9])(this->softmax,&bbox_rects,opt);
      local_d0 = (float *)((lVar32 + 4) * sVar11 * (long)pBVar22 + (long)pvVar10);
      local_d8 = (float *)((lVar32 + 3) * sVar11 * (long)pBVar22 + (long)pvVar10);
      pfVar33 = (float *)((lVar32 + 2) * sVar11 * (long)pBVar22 + (long)pvVar10);
      pfVar30 = (float *)((lVar32 + 1) * sVar11 * (long)pBVar22 + (long)pvVar10);
      pfVar23 = (float *)(sVar11 * lVar32 * (long)pBVar22 + (long)pvVar10);
      local_c8 = (float)uVar4;
      fStack_c4 = (float)((ulong)uVar4 >> 0x20);
      for (uVar16 = 0; uVar16 != uVar15; uVar16 = uVar16 + 1) {
        auVar43._4_12_ = in_XMM1._4_12_;
        auVar43._0_4_ = (float)(int)uVar16;
        lVar32 = 0;
        in_XMM1 = auVar43;
        for (uVar31 = 0; uVar31 != uVar14; uVar31 = uVar31 + 1) {
          fVar36 = expf(-*pfVar23);
          fVar40 = (1.0 / (fVar36 + 1.0) + (float)(int)uVar31) * (1.0 / fVar35);
          fVar36 = expf(-*pfVar30);
          local_48 = ZEXT416((uint)(1.0 / (fVar36 + 1.0) + auVar43._0_4_));
          fVar36 = *pfVar33;
          fVar37 = expf(*local_d8);
          fVar36 = expf(fVar36);
          fVar36 = fVar36 * local_c8 * 0.5 * local_58;
          fVar39 = fVar37 * fStack_c4 * 0.5 * fStack_54;
          fVar41 = fVar40 + fVar36;
          fVar37 = expf(-*local_d0);
          uVar26 = 0;
          uVar19 = (ulong)(uint)this->num_class;
          if (this->num_class < 1) {
            uVar19 = uVar26;
          }
          pfVar27 = (float *)((long)&(bbox_rects.
                                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->xmin +
                             uVar16 * (long)bbox_rects.
                                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage *
                             (long)iVar7 + lVar32);
          auVar44 = ZEXT816(0);
          uVar17 = 0;
          while( true ) {
            fVar45 = auVar44._0_4_;
            if (uVar19 == uVar26) break;
            fVar1 = *pfVar27;
            if (fVar45 <= fVar1) {
              auVar44._0_4_ = fVar1;
            }
            if (fVar45 < fVar1) {
              uVar17 = uVar26 & 0xffffffff;
            }
            uVar26 = uVar26 + 1;
            pfVar27 = (float *)((long)pfVar27 +
                               (long)bbox_rects.
                                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage *
                               (((long)iVar9 * (long)pBVar22 * (long)iVar8 * (long)iVar7 + 0xfU &
                                0xfffffffffffffff0) / (ulong)pBVar22));
          }
          in_XMM1._0_4_ = fVar45 / (fVar37 + 1.0);
          in_XMM1._4_12_ = auVar44._4_12_;
          confidence = in_XMM1._0_4_;
          if (this->confidence_threshold <= in_XMM1._0_4_) {
            fVar37 = (float)local_48._0_4_ * (1.0 / fVar38);
            local_70.ymax = fVar39 + fVar37;
            local_70.xmin = fVar40 - fVar36;
            local_70.ymin = fVar37 - fVar39;
            in_XMM1 = ZEXT416((uint)fVar41);
            local_70.label = (int)uVar17;
            local_70.xmax = fVar41;
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       (picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar34 * 3),&local_70);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)
                       (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar34 * 6),&confidence);
          }
          pfVar23 = pfVar23 + 1;
          pfVar30 = pfVar30 + 1;
          pfVar33 = pfVar33 + 1;
          local_d8 = local_d8 + 1;
          local_d0 = local_d0 + 1;
          lVar32 = lVar32 + 4;
        }
      }
      if (bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        (bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_finish)->xmin =
             (float)((int)(bbox_rects.
                           super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->xmin + -1);
        UNLOCK();
        if ((bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
             super__Vector_impl_data._M_finish)->xmin == 0.0) {
          if (pAVar12 == (Allocator *)0x0) {
            free(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_start);
          }
          else {
            (*pAVar12->_vptr_Allocator[3])();
          }
        }
      }
    }
    lVar34 = 8;
    for (lVar32 = 0;
        pfVar18 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start, lVar32 < (int)uVar16; lVar32 = lVar32 + 1) {
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar34 + -8),
                 *(BBoxRect **)
                  ((long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar34));
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&all_bbox_scores,
                 (const_iterator)
                 all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)((long)pfVar18 + lVar34 + -8),
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)((long)pfVar18 + lVar34));
      uVar16 = (ulong)(uint)this->num_box;
      lVar34 = lVar34 + 0x18;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)&bbox_scores);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)&picked);
    uVar28 = uVar28 + 1;
  }
  if (all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start !=
      all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start !=
        all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      qsort_descent_inplace<ncnn::BBoxRect>
                (&all_bbox_rects,&all_bbox_scores,0,
                 (int)((ulong)((long)all_bbox_scores.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)all_bbox_scores.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fVar35 = this->nms_threshold;
  pfVar18 = (pointer)(((long)all_bbox_rects.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)all_bbox_rects.
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x14);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&bbox_rects,(size_type)pfVar18,
             (allocator_type *)&bbox_scores);
  pfVar23 = &(all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
              _M_impl.super__Vector_impl_data._M_start)->xmax;
  for (pfVar21 = (pointer)0x0; pfVar18 != pfVar21; pfVar21 = (pointer)((long)pfVar21 + 1)) {
    uVar3 = ((BBoxRect *)(pfVar23 + -2))->xmin;
    uVar6 = ((BBoxRect *)(pfVar23 + -2))->ymin;
    (&(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_start)->xmin)[(long)pfVar21] =
         ((float)((ulong)*(undefined8 *)pfVar23 >> 0x20) - (float)uVar6) *
         ((float)*(undefined8 *)pfVar23 - (float)uVar3);
    pfVar23 = pfVar23 + 5;
  }
  for (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
       ._M_start = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start < pfVar18;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1)) {
    pBVar22 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
              _M_impl.super__Vector_impl_data._M_start +
              (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
    uVar16 = (ulong)((long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar28 = uVar16 & 0xffffffff;
    if ((int)uVar16 < 1) {
      uVar28 = 0;
    }
    uVar16 = 1;
    for (uVar31 = 0; uVar28 != uVar31; uVar31 = uVar31 + 1) {
      uVar13 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar31];
      fVar38 = pBVar22->xmin;
      fVar36 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar13].xmax;
      fVar37 = 0.0;
      if (fVar38 <= fVar36) {
        pBVar24 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar13;
        fVar39 = pBVar22->xmax;
        fVar40 = pBVar24->xmin;
        if (fVar40 <= fVar39) {
          fVar41 = pBVar22->ymin;
          fVar45 = pBVar24->ymax;
          if (fVar41 <= fVar45) {
            fVar1 = pBVar22->ymax;
            fVar46 = pBVar24->ymin;
            if (fVar46 <= fVar1) {
              if (fVar39 <= fVar36) {
                fVar36 = fVar39;
              }
              if (fVar40 <= fVar38) {
                fVar40 = fVar38;
              }
              if (fVar1 <= fVar45) {
                fVar45 = fVar1;
              }
              if (fVar46 <= fVar41) {
                fVar46 = fVar41;
              }
              fVar37 = (fVar45 - fVar46) * (fVar36 - fVar40);
            }
          }
        }
      }
      if (fVar35 < fVar37 / (((&(bbox_rects.
                                 super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->xmin)
                              [(long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start] - fVar37) +
                            (&(bbox_rects.
                               super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                               _M_impl.super__Vector_impl_data._M_start)->xmin)[uVar13])) {
        uVar16 = 0;
      }
    }
    if ((int)uVar16 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&picked,(value_type_conflict5 *)&bbox_scores);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&bbox_rects);
  bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (uVar28 = 0;
      uVar28 < (ulong)((long)picked.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)picked.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3); uVar28 = uVar28 + 1) {
    uVar13 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar28];
    std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
              (&bbox_rects,
               all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar13);
    std::vector<float,_std::allocator<float>_>::push_back
              (&bbox_scores,
               all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + uVar13);
  }
  uVar28 = ((long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x14;
  iVar25 = (int)uVar28;
  if (iVar25 == 0) {
    local_1b8 = 0;
  }
  else {
    this_00 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,6,iVar25,4,opt->blob_allocator);
    pvVar10 = this_00->data;
    local_1b8 = -100;
    if ((pvVar10 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      local_1b8 = 0;
      uVar28 = uVar28 & 0xffffffff;
      if (iVar25 < 1) {
        uVar28 = 0;
      }
      piVar20 = &(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start)->label;
      for (uVar16 = 0; uVar28 != uVar16; uVar16 = uVar16 + 1) {
        fVar35 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar16];
        lVar34 = (long)this_00->w * uVar16 * this_00->elemsize;
        *(float *)((long)pvVar10 + lVar34) = (float)*piVar20 + 1.0;
        *(float *)((long)pvVar10 + lVar34 + 4) = fVar35;
        *(float *)((long)pvVar10 + lVar34 + 8) = ((BBoxRect *)(piVar20 + -4))->xmin;
        *(int *)((long)pvVar10 + lVar34 + 0xc) = piVar20[-3];
        *(int *)((long)pvVar10 + lVar34 + 0x10) = piVar20[-2];
        *(int *)((long)pvVar10 + lVar34 + 0x14) = piVar20[-1];
        piVar20 = piVar20 + 5;
      }
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
            (&bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_003e0e0a:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
            (&all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
  return local_1b8;
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector<std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp * 2];
            const float bias_h = biases[pp * 2 + 1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p + 1);
            const float* wptr = bottom_top_blob.channel(p + 2);
            const float* hptr = bottom_top_blob.channel(p + 3);

            const float* box_score_ptr = bottom_top_blob.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p + 5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = expf(wptr[0]) * bias_w / w;
                    float bbox_h = expf(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //                 NCNN_LOGE("%d %f %f", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = {bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}